

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

int If_CluCheckDecInU(word t,int nVars)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  if (1 < nVars) {
    uVar5 = (long)(((ulong)((uint)t & 0x55555555) << 0x20) * 3) >> 0x20;
    uVar6 = (ulong)(int)((uint)((t & 0xaaaaaaaaaaaaaaaa) >> 1) | (uint)(t & 0xaaaaaaaaaaaaaaaa));
    uVar4 = 1;
    do {
      if (uVar4 == 6) {
        __assert_fail("iVar >= 0 && iVar < 6",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                      ,0x1bb,"word Abc_Tt6Cofactor0(word, int)");
      }
      uVar1 = s_Truths6Neg[uVar4] & uVar5;
      bVar2 = (byte)(1 << ((byte)uVar4 & 0x1f));
      uVar8 = Truth6[uVar4] & uVar5;
      uVar3 = s_Truths6Neg[uVar4] & uVar6;
      uVar7 = (uint)(uVar1 << (bVar2 & 0x3f)) | (uint)uVar1;
      uVar1 = Truth6[uVar4] & uVar6;
      if ((uVar7 == ((uint)uVar3 | (uint)(uVar3 << (bVar2 & 0x3f)))) &&
         (uVar7 == ((uint)uVar8 | (uint)(uVar8 >> (bVar2 & 0x3f))) ||
          uVar7 == ((uint)(uVar1 >> (bVar2 & 0x3f)) | (uint)uVar1))) {
        return 1;
      }
      uVar4 = uVar4 + 1;
    } while ((uint)nVars != uVar4);
  }
  return 0;
}

Assistant:

int If_CluCheckDecInU( word t, int nVars )
{
    int v, u, Cof2[2], Cof4[4];
//    for ( v = 0; v < nVars; v++ )
    for ( v = 0; v < 1; v++ ) // restrict to the first (decomposed) input
    {
        Cof2[0] = Abc_Tt6Cofactor0( t, v );
        Cof2[1] = Abc_Tt6Cofactor1( t, v );
        for ( u = v+1; u < nVars; u++ )
        {
            Cof4[0] = Abc_Tt6Cofactor0( Cof2[0], u ); // 00
            Cof4[1] = Abc_Tt6Cofactor1( Cof2[0], u ); // 01
            Cof4[2] = Abc_Tt6Cofactor0( Cof2[1], u ); // 10
            Cof4[3] = Abc_Tt6Cofactor1( Cof2[1], u ); // 11 
            if ( Cof4[0] == Cof4[1] && Cof4[0] == Cof4[2] ) //  F * a
                return 1;
            if ( Cof4[0] == Cof4[2] && Cof4[0] == Cof4[3] ) // !F * a
                return 1;
        }
    }
    return 0;
}